

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall QWidgetLineControl::updateCursorBlinking(QWidgetLineControl *this)

{
  uint uVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicTimer::stop();
  if ((*(ushort *)(this + 0x50) & 0x404) == 0x400) {
    QGuiApplication::styleHints();
    uVar1 = QStyleHints::cursorFlashTime();
    if (1 < (int)uVar1) {
      QBasicTimer::start((QBasicTimer *)(this + 0x54),(Duration)((ulong)(uVar1 >> 1) * 1000000),
                         (QObject *)this);
    }
  }
  this[0x51] = (QWidgetLineControl)((byte)this[0x51] | 2);
  inputMask((QString *)&local_40,this);
  if (local_40.size == 0) {
    local_28 = cursorRect(this);
  }
  else {
    local_28 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  updateNeeded(this,&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::updateCursorBlinking()
{
    m_blinkTimer.stop();

    if (m_blinkEnabled && !m_readOnly) {
        const auto flashTime = QGuiApplication::styleHints()->cursorFlashTime() * 1ms;
        if (flashTime >= 2ms)
            m_blinkTimer.start(flashTime / 2, this);
    }

    m_blinkStatus = 1;
    emit updateNeeded(inputMask().isEmpty() ? cursorRect() : QRect());
}